

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O2

bool __thiscall QCheckBox::hitButton(QCheckBox *this,QPoint *pos)

{
  long lVar1;
  undefined1 uVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_a8 [16];
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&opt);
  pQVar3 = QWidget::style((QWidget *)this);
  local_a8 = (**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,5,&opt,this);
  uVar2 = QRect::contains((QPoint *)local_a8,SUB81(pos,0));
  QStyleOptionButton::~QStyleOptionButton(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCheckBox::hitButton(const QPoint &pos) const
{
    QStyleOptionButton opt;
    initStyleOption(&opt);
    return style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, this).contains(pos);
}